

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O0

char * lws_urlencode(char *escaped,char *string,int len)

{
  int iVar1;
  char *pcVar2;
  char *local_30;
  char *q;
  char *p;
  int len_local;
  char *string_local;
  char *escaped_local;
  
  local_30 = escaped;
  q = string;
  p._4_4_ = len;
  while( true ) {
    iVar1 = p._4_4_;
    if (*q != '\0') {
      p._4_4_ = p._4_4_ + -1;
    }
    if (*q == '\0' || iVar1 < 4) break;
    if (*q == ' ') {
      *local_30 = '+';
      local_30 = local_30 + 1;
      q = q + 1;
    }
    else if ((((*q < '0') || ('9' < *q)) && ((*q < 'A' || ('Z' < *q)))) &&
            ((*q < 'a' || ('z' < *q)))) {
      *local_30 = '%';
      pcVar2 = local_30 + 2;
      local_30[1] = hex[(int)((int)*q >> 4 & 0xf)];
      local_30 = local_30 + 3;
      *pcVar2 = hex[(int)((int)*q & 0xf)];
      p._4_4_ = p._4_4_ + -2;
      q = q + 1;
    }
    else {
      *local_30 = *q;
      local_30 = local_30 + 1;
      q = q + 1;
    }
  }
  *local_30 = '\0';
  return escaped;
}

Assistant:

const char *
lws_urlencode(char *escaped, const char *string, int len)
{
	const char *p = string;
	char *q = escaped;

	while (*p && len-- > 3) {
		if (*p == ' ') {
			*q++ = '+';
			p++;
			continue;
		}
		if ((*p >= '0' && *p <= '9') ||
		    (*p >= 'A' && *p <= 'Z') ||
		    (*p >= 'a' && *p <= 'z')) {
			*q++ = *p++;
			continue;
		}
		*q++ = '%';
		*q++ = hex[(*p >> 4) & 0xf];
		*q++ = hex[*p & 0xf];

		len -= 2;
		p++;
	}
	*q = '\0';

	return escaped;
}